

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>::Construct
                   (DB *db,LIST *params)

{
  IfcPropertyListValue *in;
  
  in = (IfcPropertyListValue *)operator_new(0xc0);
  *(undefined ***)&in->field_0xa8 = &PTR__Object_00836880;
  *(undefined8 *)&in->field_0xb0 = 0;
  *(char **)&in->field_0xb8 = "IfcPropertyListValue";
  Assimp::IFC::Schema_2x3::IfcSimpleProperty::IfcSimpleProperty
            ((IfcSimpleProperty *)in,&PTR_construction_vtable_24__008856d0);
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined ***)in = &PTR__IfcPropertyListValue_00885640;
  *(undefined ***)&in->field_0xa8 = &PTR__IfcPropertyListValue_008856b8;
  *(undefined ***)&in->field_0x58 = &PTR__IfcPropertyListValue_00885668;
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcPropertyListValue_00885690;
  *(undefined8 *)
   &(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>).field_0x10 = 0;
  *(undefined8 *)
   &(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>).field_0x18 = 0;
  *(undefined8 *)
   &(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>).field_0x20 = 0;
  (in->Unit).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  *(undefined8 *)
   ((long)&(in->Unit).ptr.
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr + 1) = 0;
  *(undefined8 *)
   ((long)&(in->Unit).ptr.
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 1) = 0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcPropertyListValue>(db,params,in);
  return (Object *)(&in->field_0x0 + *(long *)(*(long *)in + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }